

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<long,long>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<long,long>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b1 = LessThanTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b1);
    }
  }
  if (ComparisonTestTU<long,long>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b2 = LessThanEqualTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b2);
    }
  }
  if (ComparisonTestTU<long,long>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b3 = GreaterThanTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b3);
    }
  }
  if (ComparisonTestTU<long,long>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b4 = GreaterThanEqualTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b4);
    }
  }
  if (ComparisonTestTU<long,long>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b5 = EqualTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b5);
    }
  }
  if (ComparisonTestTU<long,long>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<long,long>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<long,_long>::b6 = NotEqualTest<long,long>();
      __cxa_guard_release(&ComparisonTestTU<long,long>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}